

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O2

void __thiscall
QNetworkAccessManagerPrivate::authenticationRequired
          (QNetworkAccessManagerPrivate *this,QAuthenticator *authenticator,QNetworkReply *reply,
          bool synchronous,QUrl *url,QUrl *urlForLastAuthentication,bool allowAuthenticationReuse)

{
  QNetworkAccessManager *this_00;
  char cVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QNetworkAuthenticationCredential cred;
  QNetworkAuthenticationCredential local_f8;
  QArrayDataPointer<char16_t> local_b0;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QNetworkAccessManager **)&this->field_0x8;
  if ((allowAuthenticationReuse) &&
     ((cVar1 = QUrl::isEmpty(), cVar1 != '\0' ||
      (bVar2 = operator!=(url,urlForLastAuthentication), bVar2)))) {
    QUrl::userName(&local_f8,url,0x7f00000);
    if ((undefined1 *)local_f8.domain.d.size == (undefined1 *)0x0) {
LAB_0017963d:
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
LAB_00179647:
      local_f8.password.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.password.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.password.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.user.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.user.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.domain.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.user.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.domain.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.domain.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QNetworkAccessAuthenticationManager::fetchCachedCredentials
                (&local_f8,
                 (this->authenticationManager).
                 super___shared_ptr<QNetworkAccessAuthenticationManager,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,url,authenticator);
      if (((local_f8.domain.d.ptr != (char16_t *)0x0) || (local_f8.user.d.ptr != (char16_t *)0x0))
         || (local_f8.password.d.ptr != (char16_t *)0x0)) {
        QAuthenticator::user((QString *)&local_50,authenticator);
        bVar2 = operator!=(&local_f8.user,(QString *)&local_50);
        if (bVar2) {
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
        }
        else {
          QAuthenticator::password((QString *)&local_68,authenticator);
          bVar2 = operator!=(&local_f8.password,(QString *)&local_68);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
          if (!bVar2) goto LAB_0017969e;
        }
        QAuthenticator::setUser(authenticator,&local_f8.user);
        QAuthenticator::setPassword(authenticator,&local_f8.password);
        QUrl::operator=(urlForLastAuthentication,url);
        QNetworkAuthenticationCredential::~QNetworkAuthenticationCredential(&local_f8);
        goto LAB_0017988c;
      }
LAB_0017969e:
      QNetworkAuthenticationCredential::~QNetworkAuthenticationCredential(&local_f8);
      goto LAB_001796b0;
    }
    QUrl::password(&local_50,url,0x7f00000);
    if (local_50.size == 0) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      goto LAB_0017963d;
    }
    QUrl::userName(&local_68,url,0x7f00000);
    QAuthenticator::user((QString *)&local_80,authenticator);
    bVar2 = operator!=((QString *)&local_68,(QString *)&local_80);
    if (!bVar2) {
      QUrl::password(&local_98,url,0x7f00000);
      QAuthenticator::password((QString *)&local_b0,authenticator);
      bVar2 = operator!=((QString *)&local_98,(QString *)&local_b0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
      if (bVar2) goto LAB_001797a8;
      goto LAB_00179647;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
LAB_001797a8:
    QUrl::userName(&local_f8,url,0x7f00000);
    QAuthenticator::setUser(authenticator,&local_f8.domain);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
    QUrl::password(&local_f8,url,0x7f00000);
    QAuthenticator::setPassword(authenticator,&local_f8.domain);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
    QUrl::operator=(urlForLastAuthentication,url);
  }
  else {
LAB_001796b0:
    if (synchronous) goto LAB_0017988c;
    QUrl::operator=(urlForLastAuthentication,url);
    QNetworkAccessManager::authenticationRequired(this_00,reply,authenticator);
    if (!allowAuthenticationReuse) goto LAB_0017988c;
  }
  QNetworkAccessAuthenticationManager::cacheCredentials
            ((this->authenticationManager).
             super___shared_ptr<QNetworkAccessAuthenticationManager,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,url,authenticator);
LAB_0017988c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkAccessManagerPrivate::authenticationRequired(QAuthenticator *authenticator,
                                                          QNetworkReply *reply,
                                                          bool synchronous,
                                                          QUrl &url,
                                                          QUrl *urlForLastAuthentication,
                                                          bool allowAuthenticationReuse)
{
    Q_Q(QNetworkAccessManager);

    // don't try the cache for the same URL twice in a row
    // being called twice for the same URL means the authentication failed
    // also called when last URL is empty, e.g. on first call
    if (allowAuthenticationReuse && (urlForLastAuthentication->isEmpty()
            || url != *urlForLastAuthentication)) {
        // if credentials are included in the url, then use them, unless they were already used
        if (!url.userName().isEmpty() && !url.password().isEmpty()
            && (url.userName() != authenticator->user()
                || url.password() != authenticator->password())) {
            authenticator->setUser(url.userName(QUrl::FullyDecoded));
            authenticator->setPassword(url.password(QUrl::FullyDecoded));
            *urlForLastAuthentication = url;
            authenticationManager->cacheCredentials(url, authenticator);
            return;
        }

        QNetworkAuthenticationCredential cred = authenticationManager->fetchCachedCredentials(url, authenticator);
        if (!cred.isNull()
            && (cred.user != authenticator->user() || cred.password != authenticator->password())) {
            authenticator->setUser(cred.user);
            authenticator->setPassword(cred.password);
            *urlForLastAuthentication = url;
            return;
        }
    }

    // if we emit a signal here in synchronous mode, the user might spin
    // an event loop, which might recurse and lead to problems
    if (synchronous)
        return;

    *urlForLastAuthentication = url;
    emit q->authenticationRequired(reply, authenticator);
    if (allowAuthenticationReuse)
        authenticationManager->cacheCredentials(url, authenticator);
}